

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O0

_Bool flexfloat_sticky_bit(flexfloat_t *a,int_fast16_t exp)

{
  int iVar1;
  _Bool local_39;
  _Bool local_29;
  uint_t denorm;
  int shift;
  int_fast16_t exp_local;
  flexfloat_t *a_local;
  _Bool local_1;
  
  if ((exp < 1) && (((ulong)a->value >> 0x34 & 0x7ff) != 0)) {
    iVar1 = 1 - (int)exp;
    denorm = 0;
    if (iVar1 < 0x40) {
      denorm = ((ulong)a->value & 0xfffffffffffff | 0x10000000000000) >> ((byte)iVar1 & 0x3f);
    }
    local_29 = true;
    if ((denorm & 0xfffffffffffffU >> ((a->desc).frac_bits + 1 & 0x3f)) == 0) {
      local_39 = false;
      if ((denorm & 0xfffffffffffff) == 0) {
        local_39 = a->value != 0.0;
      }
      local_29 = local_39;
    }
    local_1 = local_29;
  }
  else {
    local_1 = ((ulong)a->value & 0xfffffffffffffU >> ((a->desc).frac_bits + 1 & 0x3f)) != 0;
  }
  return local_1;
}

Assistant:

bool flexfloat_sticky_bit(const flexfloat_t *a, int_fast16_t exp)
{
    if(exp <= 0 && EXPONENT(CAST_TO_INT(a->value)) != 0)
    {
        int shift = (- exp + 1);
        uint_t denorm = 0;
        if(shift < NUM_BITS)
            denorm = ((CAST_TO_INT(a->value) & MASK_FRAC) | MASK_FRAC_MSB) >> shift;
        return (denorm & (MASK_FRAC >> (a->desc.frac_bits + 1))) ||
               ( ((denorm & MASK_FRAC) == 0)  && (CAST_TO_INT(a->value)!=0) );
    }
    else
    {
        return CAST_TO_INT(a->value) & (MASK_FRAC >> (a->desc.frac_bits + 1));
    }
}